

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O2

path * __thiscall ghc::filesystem::path::operator/=(path *this,path *p)

{
  char cVar1;
  size_type sVar2;
  const_iterator cVar3;
  undefined8 uVar4;
  bool bVar5;
  bool bVar6;
  char cVar7;
  iterator iter;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  undefined1 local_78 [72];
  
  cVar7 = (char)this;
  if ((p->_path)._M_string_length == 0) {
    sVar2 = (this->_path)._M_string_length;
    if (sVar2 == 0) {
      return this;
    }
    cVar1 = (this->_path)._M_dataplus._M_p[sVar2 - 1];
    if (cVar1 == '/') {
      return this;
    }
    if (cVar1 == ':') {
      return this;
    }
    std::__cxx11::string::push_back(cVar7);
    return this;
  }
  bVar5 = has_root_directory(p);
  if (bVar5) {
    root_name((path *)&local_98,this);
    bVar6 = std::operator!=(&this->_path,&local_98);
    if ((bVar6) || (bVar6 = std::operator!=(&p->_path,"/"), bVar6)) {
      std::__cxx11::string::~string((string *)&local_98);
      goto LAB_0011af98;
    }
  }
  bVar6 = has_root_name(p);
  if (bVar6) {
    root_name((path *)&iter,p);
    root_name((path *)local_78,this);
    bVar6 = operator!=((path *)&iter,(path *)local_78);
    std::__cxx11::string::~string((string *)local_78);
    std::__cxx11::string::~string((string *)&iter);
    if (bVar5) {
      std::__cxx11::string::~string((string *)&local_98);
    }
    if (bVar6) {
LAB_0011af98:
      std::__cxx11::string::_M_assign((string *)this);
      return this;
    }
  }
  else if (bVar5) {
    std::__cxx11::string::~string((string *)&local_98);
  }
  bVar5 = has_root_directory(p);
  if (bVar5) {
    root_name((path *)&iter,this);
    std::__cxx11::string::_M_assign((string *)this);
    std::__cxx11::string::~string((string *)&iter);
  }
  else {
    bVar5 = has_root_directory(this);
    if (((!bVar5) && (bVar5 = has_root_directory(this), bVar5)) ||
       (bVar5 = has_filename(this), bVar5)) {
      std::__cxx11::string::push_back(cVar7);
    }
  }
  begin(&iter,p);
  bVar5 = has_root_name(p);
  if (bVar5) {
    iterator::operator++(&iter);
  }
  bVar5 = true;
  while( true ) {
    end((iterator *)local_78,p);
    uVar4 = local_78._32_8_;
    cVar3 = iter._iter;
    std::__cxx11::string::~string((string *)(local_78 + 0x28));
    if (cVar3._M_current == (char *)uVar4) break;
    if ((!bVar5) &&
       ((sVar2 = (this->_path)._M_string_length, sVar2 == 0 ||
        ((this->_path)._M_dataplus._M_p[sVar2 - 1] != '/')))) {
      std::__cxx11::string::push_back(cVar7);
    }
    iterator::operator++((iterator *)local_78,&iter,0);
    std::__cxx11::string::append((string *)this);
    std::__cxx11::string::~string((string *)(local_78 + 0x28));
    bVar5 = false;
  }
  std::__cxx11::string::~string((string *)&iter._current);
  return this;
}

Assistant:

GHC_INLINE path& path::operator/=(const path& p)
{
    if (p.empty()) {
        // was: if ((!has_root_directory() && is_absolute()) || has_filename())
        if (!_path.empty() && _path[_path.length() - 1] != preferred_separator && _path[_path.length() - 1] != ':') {
            _path += preferred_separator;
        }
        return *this;
    }
    if ((p.is_absolute() && (_path != root_name()._path || p._path != "/")) || (p.has_root_name() && p.root_name() != root_name())) {
        assign(p);
        return *this;
    }
    if (p.has_root_directory()) {
        assign(root_name());
    }
    else if ((!has_root_directory() && is_absolute()) || has_filename()) {
        _path += preferred_separator;
    }
    auto iter = p.begin();
    bool first = true;
    if (p.has_root_name()) {
        ++iter;
    }
    while (iter != p.end()) {
        if (!first && !(!_path.empty() && _path[_path.length() - 1] == preferred_separator)) {
            _path += preferred_separator;
        }
        first = false;
        _path += (*iter++).native();
    }
    check_long_path();
    return *this;
}